

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall
cmCTestRunTest::SetupResourcesEnvironment
          (cmCTestRunTest *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *log)

{
  undefined8 this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_type __val;
  reference ppVar4;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  reference local_1d0;
  ResourceAllocation *it2;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>
  *__range3;
  undefined1 local_1a8 [7];
  bool firstName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> resourceType;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>
  *it;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>
  *__range2;
  undefined1 local_100 [7];
  bool firstType;
  string resourceList;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string prefix;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>
  *process;
  iterator __end1;
  iterator __begin1;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
  *__range1;
  size_t i;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string processCount;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *log_local;
  cmCTestRunTest *this_local;
  
  processCount.field_2._8_8_ = log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"CTEST_RESOURCE_GROUP_COUNT=",&local_39);
  std::allocator<char>::~allocator(&local_39);
  __val = std::
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
          ::size(&this->AllocatedResources);
  std::__cxx11::to_string((string *)&i,__val);
  std::__cxx11::string::operator+=((string *)local_38,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  cmsys::SystemTools::PutEnv((string *)local_38);
  if (processCount.field_2._8_8_ != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)processCount.field_2._8_8_,(value_type *)local_38);
  }
  __range1 = (vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
              *)0x0;
  __end1 = std::
           vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
           ::begin(&this->AllocatedResources);
  process = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>
             *)std::
               vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
               ::end(&this->AllocatedResources);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_*,_std::vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>_>
                                *)&process);
    if (!bVar1) break;
    prefix.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_*,_std::vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>_>
         ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,"CTEST_RESOURCE_GROUP_",&local_b9);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::to_string((string *)((long)&resourceList.field_2 + 8),(unsigned_long)__range1);
    std::__cxx11::string::operator+=
              ((string *)local_b8,(string *)(resourceList.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(resourceList.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,'='
                  );
    std::__cxx11::string::operator+=((string *)local_b8,'_');
    this_00 = prefix.field_2._8_8_;
    bVar1 = true;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>
                      *)prefix.field_2._8_8_);
    it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>
                   *)this_00);
    while( true ) {
      bVar2 = std::operator!=(&__end2,(_Self *)&it);
      if (!bVar2) break;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>
               ::operator*(&__end2);
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)local_100,',');
      }
      bVar1 = false;
      std::__cxx11::string::string((string *)(var.field_2._M_local_buf + 8),(string *)ppVar4);
      std::__cxx11::string::operator+=((string *)local_100,(string *)(var.field_2._M_local_buf + 8))
      ;
      cmsys::SystemTools::UpperCase((string *)local_1a8,(string *)((long)&var.field_2 + 8));
      std::operator+(&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     &local_188,'=');
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)local_1a8);
      bVar2 = true;
      __end3 = std::
               vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>
               ::begin(&ppVar4->second);
      it2 = (ResourceAllocation *)
            std::
            vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>
            ::end(&ppVar4->second);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<const_cmCTestMultiProcessHandler::ResourceAllocation_*,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>
                                    *)&it2);
        if (!bVar3) break;
        local_1d0 = __gnu_cxx::
                    __normal_iterator<const_cmCTestMultiProcessHandler::ResourceAllocation_*,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>
                    ::operator*(&__end3);
        if (!bVar2) {
          std::__cxx11::string::operator+=((string *)local_168,';');
        }
        bVar2 = false;
        std::operator+(&local_230,"id:",&local_1d0->Id);
        std::operator+(&local_210,&local_230,",slots:");
        std::__cxx11::to_string(&local_250,local_1d0->Slots);
        std::operator+(&local_1f0,&local_210,&local_250);
        std::__cxx11::string::operator+=((string *)local_168,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        __gnu_cxx::
        __normal_iterator<const_cmCTestMultiProcessHandler::ResourceAllocation_*,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>
        ::operator++(&__end3);
      }
      cmsys::SystemTools::PutEnv((string *)local_168);
      if (processCount.field_2._8_8_ != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)processCount.field_2._8_8_,(value_type *)local_168);
      }
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)(var.field_2._M_local_buf + 8));
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>
      ::operator++(&__end2);
    }
    cmsys::SystemTools::PutEnv((string *)local_100);
    if (processCount.field_2._8_8_ != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)processCount.field_2._8_8_,(value_type *)local_100);
    }
    __range1 = (vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
                *)((long)&(__range1->
                          super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_b8);
    __gnu_cxx::
    __normal_iterator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_*,_std::vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmCTestRunTest::SetupResourcesEnvironment(std::vector<std::string>* log)
{
  std::string processCount = "CTEST_RESOURCE_GROUP_COUNT=";
  processCount += std::to_string(this->AllocatedResources.size());
  cmSystemTools::PutEnv(processCount);
  if (log) {
    log->push_back(processCount);
  }

  std::size_t i = 0;
  for (auto const& process : this->AllocatedResources) {
    std::string prefix = "CTEST_RESOURCE_GROUP_";
    prefix += std::to_string(i);
    std::string resourceList = prefix + '=';
    prefix += '_';
    bool firstType = true;
    for (auto const& it : process) {
      if (!firstType) {
        resourceList += ',';
      }
      firstType = false;
      auto resourceType = it.first;
      resourceList += resourceType;
      std::string var = prefix + cmSystemTools::UpperCase(resourceType) + '=';
      bool firstName = true;
      for (auto const& it2 : it.second) {
        if (!firstName) {
          var += ';';
        }
        firstName = false;
        var += "id:" + it2.Id + ",slots:" + std::to_string(it2.Slots);
      }
      cmSystemTools::PutEnv(var);
      if (log) {
        log->push_back(var);
      }
    }
    cmSystemTools::PutEnv(resourceList);
    if (log) {
      log->push_back(resourceList);
    }
    ++i;
  }
}